

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O1

int sat_solver3_solve_internal(sat_solver3 *s)

{
  ABC_INT64_T *pAVar1;
  float fVar2;
  double *pdVar3;
  word *pwVar4;
  lit *plVar5;
  char *pcVar6;
  double dVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  int *orderpos;
  word wVar11;
  int *piVar12;
  int *piVar13;
  uint uVar14;
  float *activity;
  ulong uVar15;
  long lVar16;
  timespec *ptVar17;
  uint *puVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  timespec *__tp;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  bool bVar29;
  float fVar30;
  double dVar31;
  timespec ts;
  uint local_b4;
  uint *local_b0;
  uint local_a0;
  ulong local_90;
  timespec local_78;
  ulong local_68;
  int local_60;
  int local_5c;
  double local_58;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  if ((s->unit_lits).size < 0) {
LAB_008f604f:
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (s->unit_lits).size = 0;
  s->nCalls = s->nCalls + 1;
  if (0 < s->verbosity) {
    puts("==================================[MINISAT]===================================");
    puts("| Conflicts |     ORIGINAL     |              LEARNT              | Progress |");
    puts("|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |");
    puts("==============================================================================");
  }
  local_a0 = 0;
  cVar8 = '\0';
  do {
    if (cVar8 != '\0') break;
    uVar14 = (s->stats).learnts;
    if (uVar14 == 0) {
      dVar31 = 0.0;
    }
    else {
      dVar31 = (double)(s->stats).learnts_literals / (double)uVar14;
    }
    if (s->nRuntimeLimit == 0) {
LAB_008f4180:
      if (0 < s->verbosity) {
        printf("| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n",
               SUB84((double)(s->stats).conflicts,0),(double)(s->stats).clauses,
               (double)(s->stats).clauses_literals,0,(double)(s->stats).learnts,
               (double)(s->stats).learnts_literals,dVar31,s->progress_estimate * 100.0);
        fflush(_stdout);
      }
      if ((int)local_a0 < 1) {
        uVar14 = 0;
        iVar9 = 0;
      }
      else {
        iVar21 = 1;
        iVar9 = 0;
        do {
          iVar9 = iVar9 + 1;
          uVar14 = iVar21 * 2;
          iVar21 = iVar21 * 2 + 1;
        } while ((int)uVar14 < (int)local_a0);
      }
      __tp = (timespec *)(ulong)local_a0;
      ptVar17 = __tp;
      if (uVar14 != local_a0) {
        do {
          iVar9 = iVar9 + -1;
          uVar15 = (long)(int)ptVar17 % (long)((int)uVar14 >> 1);
          ptVar17 = (timespec *)(uVar15 & 0xffffffff);
          uVar14 = ((int)uVar14 >> 1) - 1;
        } while (uVar14 != (uint)uVar15);
      }
      dVar31 = ldexp(1.0,iVar9);
      if (s->root_level != (s->trail_lim).size) {
        __assert_fail("s->root_level == sat_solver3_dl(s)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                      ,0x6f4,"lbool sat_solver3_search(sat_solver3 *, ABC_INT64_T)");
      }
      iVar9 = s->fNotUseRandom;
      uVar14 = s->nRestarts;
      s->nRestarts = uVar14 + 1;
      (s->stats).starts = (s->stats).starts + 1;
      local_b0 = (uint *)malloc(0x10);
      if (((uVar14 & 1) == 0) && (0 < (s->act_vars).size)) {
        lVar16 = 0;
        do {
          pdVar3 = s->factors;
          if (pdVar3 != (double *)0x0) {
            iVar21 = (s->act_vars).ptr[lVar16];
            iVar10 = s->VarActType;
            if (iVar10 == 2) {
              dVar7 = pdVar3[iVar21];
              if (dVar7 < 1.0) {
                __assert_fail("a >= 1.0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilDouble.h"
                              ,0x41,"xdbl Xdbl_FromDouble(double)");
              }
              uVar15 = ((ulong)dVar7 >> 0x34) - 0x3ff;
              if (0xffff < uVar15) goto LAB_008f608d;
              uVar19 = s->var_inc;
              uVar26 = s->activity[iVar21];
              uVar23 = uVar15 << 0x30 | (ulong)dVar7 >> 5 & 0x7fffffffffff | 0x800000000000;
              uVar15 = uVar23;
              if (uVar23 < uVar19) {
                uVar15 = uVar19;
              }
              if (uVar19 < uVar23) {
                uVar23 = uVar19;
              }
              uVar19 = uVar15 >> 0x20 & 0xffff;
              uVar25 = uVar23 >> 0x20 & 0xffff;
              uVar19 = (uVar19 * (uVar23 & 0xffffffff) >> 0xf) +
                       (uVar25 * (uVar15 & 0xffffffff) >> 0xf) +
                       ((uVar15 & 0xffffffff) * (uVar23 & 0xffffffff) >> 0x2f |
                       uVar19 * uVar25 * 0x20000);
              uVar25 = uVar19 >> (0xffffffffffff < uVar19);
              uVar19 = (ulong)(0xffffffffffff < uVar19) + (uVar23 >> 0x30) + (uVar15 >> 0x30);
              uVar15 = 0xffffffffffffffff;
              if (uVar19 < 0x10000) {
                if ((uVar25 & 0xffff800000000000) != 0x800000000000) goto LAB_008f608d;
                uVar15 = uVar19 << 0x30 | uVar25;
              }
              uVar19 = uVar15;
              if (uVar15 < uVar26) {
                uVar19 = uVar26;
              }
              if (uVar26 < uVar15) {
                uVar15 = uVar26;
              }
              uVar15 = ((uVar15 & 0xffffffffffff) >>
                       ((char)(uVar19 >> 0x30) - (char)(uVar15 >> 0x30) & 0x3fU)) +
                       (uVar19 & 0xffffffffffff);
              __tp = (timespec *)((uVar19 >> 0x30) + (ulong)(0xffffffffffff < uVar15));
              uVar15 = uVar15 >> (0xffffffffffff < uVar15);
              ptVar17 = (timespec *)0xffffffffffffffff;
              if (__tp < (timespec *)0x10000) {
                if ((uVar15 & 0x1800000000000) != 0x800000000000) goto LAB_008f608d;
                __tp = (timespec *)((long)__tp << 0x30 | uVar15);
                ptVar17 = __tp;
              }
              s->activity[iVar21] = (word)ptVar17;
              if ((timespec *)0x14c924d692ca61b < ptVar17) {
                act_var_rescale(s);
              }
              piVar12 = s->orderpos;
              uVar14 = piVar12[iVar21];
              uVar15 = (ulong)(int)uVar14;
              if (uVar15 != 0xffffffffffffffff) {
                piVar13 = (s->order).ptr;
                __tp = (timespec *)(ulong)(uint)piVar13[uVar15];
                if (uVar14 != 0) {
                  pwVar4 = s->activity;
                  uVar19 = pwVar4[piVar13[uVar15]];
                  do {
                    uVar22 = (uint)uVar15;
                    uVar27 = (int)((uVar22 - ((int)(uVar22 - 1) >> 0x1f)) + -1) >> 1;
                    iVar21 = piVar13[(int)uVar27];
                    uVar14 = uVar22;
                    if (uVar19 <= pwVar4[iVar21]) break;
                    piVar13[(int)uVar22] = iVar21;
                    piVar12[iVar21] = uVar22;
                    uVar15 = (ulong)uVar27;
                    uVar14 = uVar27;
                  } while (2 < uVar22);
                }
                goto LAB_008f4657;
              }
            }
            else if (iVar10 == 1) {
              dVar7 = (double)s->var_inc * pdVar3[iVar21] + (double)s->activity[iVar21];
              s->activity[iVar21] = (word)dVar7;
              if (1e+100 < dVar7) {
                act_var_rescale(s);
              }
              piVar12 = s->orderpos;
              uVar14 = piVar12[iVar21];
              uVar15 = (ulong)(int)uVar14;
              if (uVar15 != 0xffffffffffffffff) {
                piVar13 = (s->order).ptr;
                __tp = (timespec *)(ulong)(uint)piVar13[uVar15];
                if (uVar14 != 0) {
                  pwVar4 = s->activity;
                  uVar19 = pwVar4[piVar13[uVar15]];
                  do {
                    uVar22 = (uint)uVar15;
                    uVar27 = (int)((uVar22 - ((int)(uVar22 - 1) >> 0x1f)) + -1) >> 1;
                    iVar21 = piVar13[(int)uVar27];
                    uVar14 = uVar22;
                    if (uVar19 <= pwVar4[iVar21]) break;
                    piVar13[(int)uVar22] = iVar21;
                    piVar12[iVar21] = uVar22;
                    uVar15 = (ulong)uVar27;
                    uVar14 = uVar27;
                  } while (2 < uVar22);
                }
                goto LAB_008f4657;
              }
            }
            else {
              if (iVar10 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                              ,0x184,"void act_var_bump_factor(sat_solver3 *, int)");
              }
              wVar11 = (long)(int)((float)pdVar3[iVar21] * (float)(uint)s->var_inc) +
                       s->activity[iVar21];
              s->activity[iVar21] = wVar11;
              if ((int)wVar11 < 0) {
                act_var_rescale(s);
              }
              piVar12 = s->orderpos;
              uVar14 = piVar12[iVar21];
              uVar15 = (ulong)(int)uVar14;
              if (uVar15 != 0xffffffffffffffff) {
                piVar13 = (s->order).ptr;
                __tp = (timespec *)(ulong)(uint)piVar13[uVar15];
                if (uVar14 != 0) {
                  pwVar4 = s->activity;
                  uVar19 = pwVar4[piVar13[uVar15]];
                  do {
                    uVar22 = (uint)uVar15;
                    uVar27 = (int)((uVar22 - ((int)(uVar22 - 1) >> 0x1f)) + -1) >> 1;
                    iVar21 = piVar13[(int)uVar27];
                    uVar14 = uVar22;
                    if (uVar19 <= pwVar4[iVar21]) break;
                    piVar13[(int)uVar22] = iVar21;
                    piVar12[iVar21] = uVar22;
                    uVar15 = (ulong)uVar27;
                    uVar14 = uVar27;
                  } while (2 < uVar22);
                }
LAB_008f4657:
                piVar13[(int)uVar14] = (int)__tp;
                piVar12[(int)__tp] = uVar14;
              }
            }
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < (s->act_vars).size);
      }
      if ((s->pGlobalVars != (int *)0x0) && (0 < (s->act_vars).size)) {
        lVar16 = 0;
        do {
          if ((s->pGlobalVars != (int *)0x0) &&
             (iVar21 = (s->act_vars).ptr[lVar16], s->pGlobalVars[iVar21] != 0)) {
            iVar10 = s->VarActType;
            if (iVar10 == 2) {
              uVar15 = s->var_inc;
              uVar19 = 0x1c00000000000;
              if (uVar15 < 0x1c00000000000) {
                uVar19 = uVar15;
              }
              if (uVar15 < 0x1c00000000001) {
                uVar15 = 0x1c00000000000;
              }
              uVar26 = s->activity[iVar21];
              uVar23 = uVar15 >> 0x20 & 0xffff;
              uVar25 = uVar19 >> 0x20 & 0xffff;
              uVar23 = (uVar23 * (uVar19 & 0xffffffff) >> 0xf) +
                       (uVar25 * (uVar15 & 0xffffffff) >> 0xf) +
                       ((uVar15 & 0xffffffff) * (uVar19 & 0xffffffff) >> 0x2f |
                       uVar23 * uVar25 * 0x20000);
              uVar25 = uVar23 >> (0xffffffffffff < uVar23);
              uVar19 = (ulong)(0xffffffffffff < uVar23) + (uVar19 >> 0x30) + (uVar15 >> 0x30);
              uVar15 = 0xffffffffffffffff;
              if (uVar19 < 0x10000) {
                if ((uVar25 & 0xffff800000000000) != 0x800000000000) goto LAB_008f608d;
                uVar15 = uVar19 << 0x30 | uVar25;
              }
              uVar19 = uVar15;
              if (uVar15 < uVar26) {
                uVar19 = uVar26;
              }
              if (uVar26 < uVar15) {
                uVar15 = uVar26;
              }
              uVar15 = ((uVar15 & 0xffffffffffff) >>
                       ((char)(uVar19 >> 0x30) - (char)(uVar15 >> 0x30) & 0x3fU)) +
                       (uVar19 & 0xffffffffffff);
              __tp = (timespec *)((uVar19 >> 0x30) + (ulong)(0xffffffffffff < uVar15));
              uVar15 = uVar15 >> (0xffffffffffff < uVar15);
              ptVar17 = (timespec *)0xffffffffffffffff;
              if (__tp < (timespec *)0x10000) {
                if ((uVar15 & 0x1800000000000) != 0x800000000000) goto LAB_008f608d;
                __tp = (timespec *)((long)__tp << 0x30 | uVar15);
                ptVar17 = __tp;
              }
              s->activity[iVar21] = (word)ptVar17;
              if ((timespec *)0x14c924d692ca61b < ptVar17) {
                act_var_rescale(s);
              }
              piVar12 = s->orderpos;
              uVar14 = piVar12[iVar21];
              uVar15 = (ulong)(int)uVar14;
              if (uVar15 != 0xffffffffffffffff) {
                piVar13 = (s->order).ptr;
                __tp = (timespec *)(ulong)(uint)piVar13[uVar15];
                if (uVar14 != 0) {
                  pwVar4 = s->activity;
                  uVar19 = pwVar4[piVar13[uVar15]];
                  do {
                    uVar22 = (uint)uVar15;
                    uVar27 = (int)((uVar22 - ((int)(uVar22 - 1) >> 0x1f)) + -1) >> 1;
                    iVar21 = piVar13[(int)uVar27];
                    uVar14 = uVar22;
                    if (uVar19 <= pwVar4[iVar21]) break;
                    piVar13[(int)uVar22] = iVar21;
                    piVar12[iVar21] = uVar22;
                    uVar15 = (ulong)uVar27;
                    uVar14 = uVar27;
                  } while (2 < uVar22);
                }
                goto LAB_008f49f2;
              }
            }
            else if (iVar10 == 1) {
              dVar7 = (double)s->var_inc * 3.0 + (double)s->activity[iVar21];
              s->activity[iVar21] = (word)dVar7;
              if (1e+100 < dVar7) {
                act_var_rescale(s);
              }
              piVar12 = s->orderpos;
              uVar14 = piVar12[iVar21];
              uVar15 = (ulong)(int)uVar14;
              if (uVar15 != 0xffffffffffffffff) {
                piVar13 = (s->order).ptr;
                __tp = (timespec *)(ulong)(uint)piVar13[uVar15];
                if (uVar14 != 0) {
                  pwVar4 = s->activity;
                  uVar19 = pwVar4[piVar13[uVar15]];
                  do {
                    uVar22 = (uint)uVar15;
                    uVar27 = (int)((uVar22 - ((int)(uVar22 - 1) >> 0x1f)) + -1) >> 1;
                    iVar21 = piVar13[(int)uVar27];
                    uVar14 = uVar22;
                    if (uVar19 <= pwVar4[iVar21]) break;
                    piVar13[(int)uVar22] = iVar21;
                    piVar12[iVar21] = uVar22;
                    uVar15 = (ulong)uVar27;
                    uVar14 = uVar27;
                  } while (2 < uVar22);
                }
                goto LAB_008f49f2;
              }
            }
            else {
              if (iVar10 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                              ,0x165,"void act_var_bump_global(sat_solver3 *, int)");
              }
              wVar11 = ((long)((s->var_inc << 0x20) * 3) >> 0x20) + s->activity[iVar21];
              s->activity[iVar21] = wVar11;
              if ((int)wVar11 < 0) {
                act_var_rescale(s);
              }
              piVar12 = s->orderpos;
              uVar14 = piVar12[iVar21];
              uVar15 = (ulong)(int)uVar14;
              if (uVar15 != 0xffffffffffffffff) {
                piVar13 = (s->order).ptr;
                __tp = (timespec *)(ulong)(uint)piVar13[uVar15];
                if (uVar14 != 0) {
                  pwVar4 = s->activity;
                  uVar19 = pwVar4[piVar13[uVar15]];
                  do {
                    uVar22 = (uint)uVar15;
                    uVar27 = (int)((uVar22 - ((int)(uVar22 - 1) >> 0x1f)) + -1) >> 1;
                    iVar21 = piVar13[(int)uVar27];
                    uVar14 = uVar22;
                    if (uVar19 <= pwVar4[iVar21]) break;
                    piVar13[(int)uVar22] = iVar21;
                    piVar12[iVar21] = uVar22;
                    uVar15 = (ulong)uVar27;
                    uVar14 = uVar27;
                  } while (2 < uVar22);
                }
LAB_008f49f2:
                piVar13[(int)uVar14] = (int)__tp;
                piVar12[(int)__tp] = uVar14;
              }
            }
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < (s->act_vars).size);
      }
      local_58 = 0.019999999552965164;
      if (iVar9 != 0) {
        local_58 = 0.0;
      }
      local_40 = (long)(dVar31 * 100.0);
      local_a0 = local_a0 + 1;
      local_90 = 4;
      uVar15 = 0;
      local_50 = 0;
      cVar8 = '\x04';
      do {
        uVar14 = sat_solver3_propagate(s);
        if (uVar14 == 0) {
          if ((local_50 < local_40 || local_40 < 0) || s->fNoRestarts != 0) {
            if ((s->nRuntimeLimit != 0) && (((s->stats).conflicts & 0x3f) == 0)) {
              __tp = &local_78;
              iVar9 = clock_gettime(3,__tp);
              if (iVar9 < 0) {
                lVar16 = -1;
              }
              else {
                lVar16 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
              }
              if (s->nRuntimeLimit < lVar16) goto LAB_008f5c3d;
            }
            if (((s->nConfLimit != 0) && (s->nConfLimit < (s->stats).conflicts)) ||
               ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) goto LAB_008f5c3d;
            if (((s->trail_lim).size == 0) && (s->fSkipSimplify == 0)) {
              sat_solver3_simplify(s);
            }
            if ((s->nLearntMax != 0) && (s->nLearntMax <= (s->act_clas).size)) {
              sat_solver3_reducedb(s);
            }
            pAVar1 = &(s->stats).decisions;
            *pAVar1 = *pAVar1 + 1;
            piVar12 = s->orderpos;
            dVar31 = s->random_seed * 1389796.0;
            puVar18 = (uint *)(s->order).ptr;
            dVar31 = dVar31 - (double)(int)(dVar31 / 2147483647.0) * 2147483647.0;
            s->random_seed = dVar31;
            if (local_58 <= dVar31 / 2147483647.0) goto LAB_008f5da8;
            dVar31 = dVar31 * 1389796.0 -
                     (double)(int)((dVar31 * 1389796.0) / 2147483647.0) * 2147483647.0;
            s->random_seed = dVar31;
            uVar14 = (uint)((double)s->size * (dVar31 / 2147483647.0));
            __tp = (timespec *)(ulong)uVar14;
            if (((int)uVar14 < 0) || (s->size <= (int)uVar14)) {
              __assert_fail("next >= 0 && next < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                            ,0xb4,"int order_select(sat_solver3 *, float)");
            }
            bVar29 = s->assigns[uVar14] != '\x03';
            while (bVar29) {
LAB_008f5da8:
              iVar9 = (s->order).size;
              if ((long)iVar9 < 1) {
                uVar14 = 0xffffffff;
                break;
              }
              uVar14 = *puVar18;
              iVar21 = iVar9 + -1;
              uVar22 = puVar18[(long)iVar9 + -1];
              (s->order).size = iVar21;
              piVar12[(int)uVar14] = -1;
              if (iVar9 != 1) {
                iVar10 = 0;
                if (2 < iVar9) {
                  pwVar4 = s->activity;
                  uVar19 = pwVar4[(int)uVar22];
                  iVar9 = 1;
                  iVar10 = 0;
                  do {
                    iVar28 = iVar9 + 1;
                    iVar20 = iVar9;
                    if ((iVar28 < iVar21) &&
                       (iVar20 = iVar28, pwVar4[(int)puVar18[iVar28]] <= pwVar4[(int)puVar18[iVar9]]
                       )) {
                      iVar20 = iVar9;
                    }
                    uVar27 = puVar18[iVar20];
                    if (pwVar4[(int)uVar27] <= uVar19) break;
                    puVar18[iVar10] = uVar27;
                    piVar12[(int)uVar27] = iVar10;
                    iVar9 = iVar20 * 2 + 1;
                    iVar10 = iVar20;
                  } while (iVar9 < iVar21);
                }
                puVar18[iVar10] = uVar22;
                piVar12[(int)uVar22] = iVar10;
              }
              bVar29 = s->assigns[(int)uVar14] != '\x03';
              __tp = (timespec *)((ulong)__tp & 0xffffffff);
              if (!bVar29) {
                __tp = (timespec *)(ulong)uVar14;
              }
              uVar14 = (uint)__tp;
            }
            if (uVar14 == 0xffffffff) {
              if (0 < s->size) {
                pcVar6 = s->assigns;
                piVar12 = s->model;
                lVar16 = 0;
                do {
                  piVar12[lVar16] = -(uint)(pcVar6[lVar16] != '\0') | 1;
                  lVar16 = lVar16 + 1;
                } while (lVar16 < s->size);
              }
              __tp = (timespec *)(ulong)(uint)s->root_level;
              sat_solver3_canceluntil(s,s->root_level);
              cVar8 = '\x01';
              if (local_b0 != (uint *)0x0) {
                free(local_b0);
                local_b0 = (uint *)0x0;
              }
              bVar29 = false;
            }
            else {
              uVar22 = uVar14 * 2;
              if (s->polarity[(int)uVar14] == '\0') {
                uVar22 = uVar22 | 1;
              }
              __tp = (timespec *)(ulong)uVar22;
              sat_solver3_decision(s,uVar22);
              bVar29 = true;
            }
          }
          else {
LAB_008f5c3d:
            dVar31 = sat_solver3_progress(s);
            s->progress_estimate = dVar31;
            __tp = (timespec *)(ulong)(uint)s->root_level;
            sat_solver3_canceluntil(s,s->root_level);
            if (local_b0 != (uint *)0x0) {
              free(local_b0);
              local_b0 = (uint *)0x0;
            }
            bVar29 = false;
            cVar8 = '\0';
          }
          if (bVar29) goto LAB_008f5c87;
          bVar29 = false;
        }
        else {
          pAVar1 = &(s->stats).conflicts;
          *pAVar1 = *pAVar1 + 1;
          local_5c = (s->trail_lim).size;
          local_60 = s->root_level;
          if (local_5c == local_60) {
            __tp = (timespec *)(ulong)uVar14;
            sat_solver3_analyze_final(s,uVar14,0);
            cVar8 = -1;
            if (local_b0 != (uint *)0x0) {
              free(local_b0);
              local_b0 = (uint *)0x0;
            }
          }
          else {
            if ((int)uVar15 < 0) goto LAB_008f604f;
            plVar5 = s->trail;
            iVar9 = s->qtail;
            if ((int)local_90 == 0) {
              if (local_b0 == (uint *)0x0) {
                local_b0 = (uint *)malloc(0);
              }
              else {
                local_b0 = (uint *)realloc(local_b0,0);
              }
              local_90 = 0;
              if (local_b0 == (uint *)0x0) {
                printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",0,0);
                fflush(_stdout);
              }
            }
            iVar9 = iVar9 + -1;
            *local_b0 = 0xfffffffe;
            uVar22 = 0xfffffffe;
            local_b4 = 1;
            iVar21 = 0;
            do {
              if (uVar14 == 0) {
                __assert_fail("h != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                              ,0x37c,"void sat_solver3_analyze(sat_solver3 *, int, veci *)");
              }
              if ((uVar14 & 1) == 0) {
                uVar27 = (s->Mem).uPageMask & uVar14;
                if (uVar27 == 0) {
LAB_008f6011:
                  __assert_fail("k",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satClause.h"
                                ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
                }
                puVar18 = (uint *)((s->Mem).pPages[(int)uVar14 >> ((byte)(s->Mem).nPageSize & 0x1f)]
                                  + (int)uVar27);
                if ((*puVar18 & 1) != 0) {
                  piVar12 = (s->act_clas).ptr;
                  uVar14 = puVar18[(ulong)(*puVar18 >> 0xb) + 1];
                  if (s->ClaActType == 0) {
                    piVar13 = piVar12 + (int)uVar14;
                    *piVar13 = *piVar13 + s->cla_inc;
                    if (*piVar13 < 0) {
                      uVar14 = (s->act_clas).size;
                      if (s->ClaActType != 0) {
                        if (0 < (int)uVar14) {
                          uVar15 = 0;
                          do {
                            piVar12[uVar15] = (int)((float)piVar12[uVar15] * 1e-20);
                            uVar15 = uVar15 + 1;
                          } while (uVar14 != uVar15);
                        }
                        fVar30 = (float)s->cla_inc;
                        goto LAB_008f4d8a;
                      }
                      if (0 < (int)uVar14) {
                        lVar16 = 0;
                        do {
                          piVar12[lVar16] = (uint)piVar12[lVar16] >> 0xe;
                          lVar16 = lVar16 + 1;
                        } while (lVar16 < (s->act_clas).size);
                      }
                      uVar14 = s->cla_inc >> 0xe;
                      if (uVar14 < 0x401) {
                        uVar14 = 0x400;
                      }
                      goto LAB_008f4d8f;
                    }
                  }
                  else {
                    fVar30 = (float)s->cla_inc;
                    fVar2 = (float)piVar12[(int)uVar14];
                    piVar12[(int)uVar14] = (int)(fVar2 + fVar30);
                    if (1e+20 < fVar2 + fVar30) {
                      lVar16 = (long)(s->act_clas).size;
                      if (0 < lVar16) {
                        lVar24 = 0;
                        do {
                          piVar12[lVar24] = (int)((float)piVar12[lVar24] * 1e-20);
                          lVar24 = lVar24 + 1;
                        } while (lVar16 != lVar24);
                      }
LAB_008f4d8a:
                      uVar14 = (uint)(long)(fVar30 * 1e-20);
LAB_008f4d8f:
                      s->cla_inc = uVar14;
                    }
                  }
                }
                if ((uint)(uVar22 != 0xfffffffe) < *puVar18 >> 0xb) {
                  uVar15 = (ulong)(uVar22 != 0xfffffffe);
                  do {
                    iVar10 = (int)puVar18[uVar15 + 1] >> 1;
                    if ((s->tags[iVar10] == '\0') && (0 < s->levels[iVar10])) {
                      uVar14 = (s->tagged).cap;
                      if ((s->tagged).size == uVar14) {
                        iVar20 = (uVar14 >> 1) * 3;
                        if ((int)uVar14 < 4) {
                          iVar20 = uVar14 * 2;
                        }
                        piVar12 = (s->tagged).ptr;
                        if (piVar12 == (int *)0x0) {
                          piVar12 = (int *)malloc((long)iVar20 << 2);
                        }
                        else {
                          piVar12 = (int *)realloc(piVar12,(long)iVar20 << 2);
                        }
                        (s->tagged).ptr = piVar12;
                        if (piVar12 == (int *)0x0) {
                          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                                 SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                                 (double)iVar20 * 9.5367431640625e-07);
                          fflush(_stdout);
                        }
                        (s->tagged).cap = iVar20;
                      }
                      iVar20 = (s->tagged).size;
                      (s->tagged).size = iVar20 + 1;
                      (s->tagged).ptr[iVar20] = iVar10;
                      s->tags[iVar10] = '\x01';
                      act_var_bump(s,iVar10);
                      if (s->levels[iVar10] == (s->trail_lim).size) {
                        iVar21 = iVar21 + 1;
                      }
                      else {
                        uVar14 = puVar18[uVar15 + 1];
                        uVar22 = (uint)local_90;
                        if (local_b4 == uVar22) {
                          uVar27 = (int)(local_90 >> 1) * 3;
                          if ((int)uVar22 < 4) {
                            uVar27 = uVar22 * 2;
                          }
                          local_90 = (ulong)uVar27;
                          if (local_b0 == (uint *)0x0) {
                            local_b0 = (uint *)malloc((long)(int)uVar27 << 2);
                          }
                          else {
                            local_b0 = (uint *)realloc(local_b0,(long)(int)uVar27 << 2);
                          }
                          if (local_b0 == (uint *)0x0) {
                            printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                                   SUB84((double)(int)uVar22 * 9.5367431640625e-07,0),
                                   (double)(int)uVar27 * 9.5367431640625e-07);
                            fflush(_stdout);
                          }
                        }
                        lVar16 = (long)(int)local_b4;
                        local_b4 = local_b4 + 1;
                        local_b0[lVar16] = uVar14;
                      }
                    }
                    uVar15 = uVar15 + 1;
                  } while (uVar15 < *puVar18 >> 0xb);
                }
              }
              else {
                iVar10 = (int)uVar14 >> 2;
                if ((s->tags[iVar10] == '\0') && (0 < s->levels[iVar10])) {
                  uVar22 = (s->tagged).cap;
                  if ((s->tagged).size == uVar22) {
                    iVar20 = (uVar22 >> 1) * 3;
                    if ((int)uVar22 < 4) {
                      iVar20 = uVar22 * 2;
                    }
                    piVar12 = (s->tagged).ptr;
                    if (piVar12 == (int *)0x0) {
                      piVar12 = (int *)malloc((long)iVar20 << 2);
                    }
                    else {
                      piVar12 = (int *)realloc(piVar12,(long)iVar20 << 2);
                    }
                    (s->tagged).ptr = piVar12;
                    if (piVar12 == (int *)0x0) {
                      printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                             SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                             (double)iVar20 * 9.5367431640625e-07);
                      fflush(_stdout);
                    }
                    (s->tagged).cap = iVar20;
                  }
                  iVar20 = (s->tagged).size;
                  (s->tagged).size = iVar20 + 1;
                  (s->tagged).ptr[iVar20] = iVar10;
                  s->tags[iVar10] = '\x01';
                  act_var_bump(s,iVar10);
                  if (s->levels[iVar10] == (s->trail_lim).size) {
                    iVar21 = iVar21 + 1;
                  }
                  else {
                    uVar22 = (uint)local_90;
                    if (local_b4 == uVar22) {
                      uVar27 = (int)(local_90 >> 1) * 3;
                      if ((int)uVar22 < 4) {
                        uVar27 = uVar22 * 2;
                      }
                      local_90 = (ulong)uVar27;
                      if (local_b0 == (uint *)0x0) {
                        local_b0 = (uint *)malloc((long)(int)uVar27 << 2);
                      }
                      else {
                        local_b0 = (uint *)realloc(local_b0,(long)(int)uVar27 << 2);
                      }
                      if (local_b0 == (uint *)0x0) {
                        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                               SUB84((double)(int)uVar22 * 9.5367431640625e-07,0),
                               (double)(int)uVar27 * 9.5367431640625e-07);
                        fflush(_stdout);
                      }
                    }
                    lVar16 = (long)(int)local_b4;
                    local_b4 = local_b4 + 1;
                    local_b0[lVar16] = (int)uVar14 >> 1;
                  }
                }
              }
              puVar18 = (uint *)(plVar5 + iVar9);
              do {
                uVar22 = *puVar18;
                puVar18 = puVar18 + -1;
                iVar9 = iVar9 + -1;
              } while (s->tags[(int)uVar22 >> 1] == '\0');
              uVar14 = s->reasons[(int)uVar22 >> 1];
              bVar29 = 1 < iVar21;
              iVar21 = iVar21 + -1;
            } while (bVar29);
            *local_b0 = uVar22 ^ 1;
            uVar14 = 0;
            if (1 < (int)local_b4) {
              uVar14 = 0;
              uVar15 = 1;
              do {
                uVar14 = uVar14 | 1 << (*(byte *)(s->levels + ((int)local_b0[uVar15] >> 1)) & 0x1f);
                uVar15 = uVar15 + 1;
              } while (local_b4 != uVar15);
            }
            uVar15 = 1;
            if (1 < (int)local_b4) {
              local_38 = (ulong)local_b4;
              uVar15 = 1;
              uVar19 = 1;
              do {
                uVar22 = local_b0[uVar19];
                if (s->reasons[(int)uVar22 >> 1] == 0) {
LAB_008f57ee:
                  local_b0[(int)uVar15] = local_b0[uVar19];
                  uVar15 = (ulong)((int)uVar15 + 1);
                }
                else {
                  if ((s->stack).size < 0) goto LAB_008f604f;
                  iVar9 = (s->tagged).size;
                  (s->stack).size = 0;
                  if ((s->stack).cap == 0) {
                    piVar12 = (s->stack).ptr;
                    if (piVar12 == (int *)0x0) {
                      piVar12 = (int *)malloc(0);
                    }
                    else {
                      piVar12 = (int *)realloc(piVar12,0);
                    }
                    (s->stack).ptr = piVar12;
                    if (piVar12 == (int *)0x0) {
                      printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                             SUB84((double)(s->stack).cap * 9.5367431640625e-07,0),0);
                      fflush(_stdout);
                    }
                    (s->stack).cap = 0;
                  }
                  iVar21 = (s->stack).size;
                  (s->stack).size = iVar21 + 1;
                  (s->stack).ptr[iVar21] = (int)uVar22 >> 1;
                  iVar21 = (s->stack).size;
                  if (iVar21 != 0) {
                    local_48 = (long)iVar9;
                    local_68 = uVar15;
                    do {
                      piVar12 = s->reasons;
                      piVar13 = (s->stack).ptr;
                      (s->stack).size = iVar21 - 1U;
                      uVar22 = piVar12[piVar13[(long)iVar21 + -1]];
                      if (uVar22 == 0) {
                        __assert_fail("s->reasons[v] != 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                                      ,0x2ef,
                                      "int sat_solver3_lit_removable(sat_solver3 *, int, int)");
                      }
                      if ((uVar22 & 1) != 0) {
                        iVar10 = (int)uVar22 >> 2;
                        if ((s->tags[iVar10] != '\0') || (s->levels[iVar10] == 0))
                        goto LAB_008f5770;
                        if ((piVar12[iVar10] != 0) &&
                           ((uVar14 >> (s->levels[iVar10] & 0x1fU) & 1) != 0)) {
                          uVar22 = (s->stack).cap;
                          if (iVar21 - 1U == uVar22) {
                            iVar21 = (uVar22 >> 1) * 3;
                            if ((int)uVar22 < 4) {
                              iVar21 = uVar22 * 2;
                            }
                            if (piVar13 == (int *)0x0) {
                              piVar12 = (int *)malloc((long)iVar21 << 2);
                            }
                            else {
                              piVar12 = (int *)realloc(piVar13,(long)iVar21 << 2);
                            }
                            (s->stack).ptr = piVar12;
                            if (piVar12 == (int *)0x0) {
                              printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                                     SUB84((double)(s->stack).cap * 9.5367431640625e-07,0),
                                     (double)iVar21 * 9.5367431640625e-07);
                              fflush(_stdout);
                            }
                            (s->stack).cap = iVar21;
                          }
                          iVar21 = (s->stack).size;
                          (s->stack).size = iVar21 + 1;
                          (s->stack).ptr[iVar21] = iVar10;
                          if (s->tags[iVar10] == '\0') {
                            uVar22 = (s->tagged).cap;
                            if ((s->tagged).size == uVar22) {
                              iVar21 = (uVar22 >> 1) * 3;
                              if ((int)uVar22 < 4) {
                                iVar21 = uVar22 * 2;
                              }
                              piVar12 = (s->tagged).ptr;
                              if (piVar12 == (int *)0x0) {
                                piVar12 = (int *)malloc((long)iVar21 << 2);
                              }
                              else {
                                piVar12 = (int *)realloc(piVar12,(long)iVar21 << 2);
                              }
                              (s->tagged).ptr = piVar12;
                              if (piVar12 == (int *)0x0) {
                                printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                                       SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                                       (double)iVar21 * 9.5367431640625e-07);
                                fflush(_stdout);
                              }
                              (s->tagged).cap = iVar21;
                            }
                            iVar21 = (s->tagged).size;
                            (s->tagged).size = iVar21 + 1;
                            (s->tagged).ptr[iVar21] = iVar10;
                          }
                          s->tags[iVar10] = '\x01';
                          goto LAB_008f5770;
                        }
                        iVar21 = (s->tagged).size;
                        if (iVar9 < iVar21) {
                          piVar12 = (s->tagged).ptr;
                          lVar16 = local_48;
                          do {
                            s->tags[piVar12[lVar16]] = '\0';
                            lVar16 = lVar16 + 1;
                            iVar21 = (s->tagged).size;
                          } while (lVar16 < iVar21);
                        }
LAB_008f57d4:
                        if (iVar21 < iVar9) goto LAB_008f604f;
                        (s->tagged).size = iVar9;
                        uVar15 = local_68;
                        goto LAB_008f57ee;
                      }
                      uVar27 = (s->Mem).uPageMask & uVar22;
                      if (uVar27 == 0) goto LAB_008f6011;
                      piVar12 = (s->Mem).pPages[(int)uVar22 >> ((byte)(s->Mem).nPageSize & 0x1f)];
                      if (0xfff < (uint)piVar12[(int)uVar27]) {
                        uVar15 = 1;
                        do {
                          iVar21 = piVar12[(long)(int)uVar27 + uVar15 + 1] >> 1;
                          if ((s->tags[iVar21] == '\0') && (s->levels[iVar21] != 0)) {
                            if ((s->reasons[iVar21] == 0) ||
                               ((uVar14 >> (s->levels[iVar21] & 0x1fU) & 1) == 0)) {
                              iVar21 = (s->tagged).size;
                              if (iVar9 < iVar21) {
                                piVar12 = (s->tagged).ptr;
                                lVar16 = local_48;
                                do {
                                  s->tags[piVar12[lVar16]] = '\0';
                                  lVar16 = lVar16 + 1;
                                  iVar21 = (s->tagged).size;
                                } while (lVar16 < iVar21);
                              }
                              goto LAB_008f57d4;
                            }
                            uVar22 = (s->stack).cap;
                            if ((s->stack).size == uVar22) {
                              iVar10 = (uVar22 >> 1) * 3;
                              if ((int)uVar22 < 4) {
                                iVar10 = uVar22 * 2;
                              }
                              piVar13 = (s->stack).ptr;
                              if (piVar13 == (int *)0x0) {
                                piVar13 = (int *)malloc((long)iVar10 << 2);
                              }
                              else {
                                piVar13 = (int *)realloc(piVar13,(long)iVar10 << 2);
                              }
                              (s->stack).ptr = piVar13;
                              if (piVar13 == (int *)0x0) {
                                printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                                       SUB84((double)(s->stack).cap * 9.5367431640625e-07,0),
                                       (double)iVar10 * 9.5367431640625e-07);
                                fflush(_stdout);
                              }
                              (s->stack).cap = iVar10;
                            }
                            iVar10 = (s->stack).size;
                            (s->stack).size = iVar10 + 1;
                            (s->stack).ptr[iVar10] = iVar21;
                            if (s->tags[iVar21] == '\0') {
                              uVar22 = (s->tagged).cap;
                              if ((s->tagged).size == uVar22) {
                                iVar10 = (uVar22 >> 1) * 3;
                                if ((int)uVar22 < 4) {
                                  iVar10 = uVar22 * 2;
                                }
                                piVar13 = (s->tagged).ptr;
                                if (piVar13 == (int *)0x0) {
                                  piVar13 = (int *)malloc((long)iVar10 << 2);
                                }
                                else {
                                  piVar13 = (int *)realloc(piVar13,(long)iVar10 << 2);
                                }
                                (s->tagged).ptr = piVar13;
                                if (piVar13 == (int *)0x0) {
                                  printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                                         SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                                         (double)iVar10 * 9.5367431640625e-07);
                                  fflush(_stdout);
                                }
                                (s->tagged).cap = iVar10;
                              }
                              iVar10 = (s->tagged).size;
                              (s->tagged).size = iVar10 + 1;
                              (s->tagged).ptr[iVar10] = iVar21;
                            }
                            s->tags[iVar21] = '\x01';
                          }
                          uVar15 = uVar15 + 1;
                        } while (uVar15 < (uint)piVar12[(int)uVar27] >> 0xb);
                      }
LAB_008f5770:
                      iVar21 = (s->stack).size;
                      uVar15 = local_68;
                    } while (iVar21 != 0);
                  }
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != local_38);
            }
            iVar9 = (int)uVar15;
            if ((int)local_b4 < iVar9) goto LAB_008f604f;
            pAVar1 = &(s->stats).tot_literals;
            *pAVar1 = *pAVar1 + (long)iVar9;
            iVar21 = (s->tagged).size;
            if (0 < iVar21) {
              piVar12 = (s->tagged).ptr;
              lVar16 = 0;
              do {
                s->tags[piVar12[lVar16]] = '\0';
                lVar16 = lVar16 + 1;
                iVar21 = (s->tagged).size;
              } while (lVar16 < iVar21);
            }
            if (iVar21 < 0) goto LAB_008f604f;
            (s->tagged).size = 0;
            if (iVar9 < 2) {
              sat_solver3_canceluntil(s,s->root_level);
              iVar21 = 0;
            }
            else {
              uVar14 = local_b0[1];
              piVar12 = s->levels;
              lVar16 = 1;
              if (iVar9 != 2) {
                iVar21 = piVar12[(int)uVar14 >> 1];
                uVar19 = 1;
                uVar26 = 2;
                do {
                  if (iVar21 < piVar12[(int)local_b0[uVar26] >> 1]) {
                    uVar19 = uVar26 & 0xffffffff;
                    iVar21 = piVar12[(int)local_b0[uVar26] >> 1];
                  }
                  uVar26 = uVar26 + 1;
                } while ((uVar15 & 0xffffffff) != uVar26);
                lVar16 = (long)(int)uVar19;
              }
              local_b0[1] = local_b0[lVar16];
              local_b0[lVar16] = uVar14;
              iVar21 = piVar12[(int)local_b0[1] >> 1];
              if (piVar12[(int)local_b0[1] >> 1] < s->root_level) {
                iVar21 = s->root_level;
              }
              sat_solver3_canceluntil(s,iVar21);
              iVar21 = sat_solver3_clause_new
                                 (s,(lit *)local_b0,(lit *)(local_b0 + (uVar15 & 0xffffffff)),1);
            }
            uVar14 = *local_b0;
            lVar16 = (long)((int)uVar14 >> 1);
            if (s->pFreqs[lVar16] == '\0') {
              s->pFreqs[lVar16] = '\x01';
            }
            __tp = (timespec *)s->assigns;
            if (*(char *)((long)&__tp->tv_sec + lVar16) == '\x03') {
              *(byte *)((long)&__tp->tv_sec + lVar16) = (byte)uVar14 & 1;
              s->levels[lVar16] = (s->trail_lim).size;
              s->reasons[lVar16] = iVar21;
              __tp = (timespec *)(long)s->qtail;
              s->qtail = s->qtail + 1;
              s->trail[(long)__tp] = uVar14;
            }
            if (iVar9 < 1) {
              __assert_fail("veci_size(cls) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                            ,0x2bf,"void sat_solver3_record(sat_solver3 *, veci *)");
            }
            if (iVar21 == 0) {
              uVar14 = *local_b0;
              uVar22 = (s->unit_lits).cap;
              if ((s->unit_lits).size == uVar22) {
                iVar21 = (uVar22 >> 1) * 3;
                if ((int)uVar22 < 4) {
                  iVar21 = uVar22 * 2;
                }
                piVar12 = (s->unit_lits).ptr;
                __tp = (timespec *)((long)iVar21 << 2);
                if (piVar12 == (int *)0x0) {
                  piVar12 = (int *)malloc((size_t)__tp);
                }
                else {
                  piVar12 = (int *)realloc(piVar12,(size_t)__tp);
                }
                (s->unit_lits).ptr = piVar12;
                if (piVar12 == (int *)0x0) {
                  printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                         SUB84((double)(s->unit_lits).cap * 9.5367431640625e-07,0),
                         (double)iVar21 * 9.5367431640625e-07);
                  fflush(_stdout);
                }
                (s->unit_lits).cap = iVar21;
              }
              iVar21 = (s->unit_lits).size;
              (s->unit_lits).size = iVar21 + 1;
              (s->unit_lits).ptr[iVar21] = uVar14;
            }
            if (iVar9 == 1) {
              s->levels[(int)*local_b0 >> 1] = 0;
            }
            iVar9 = s->VarActType;
            if (iVar9 == 2) {
              uVar19 = s->var_inc;
              uVar26 = s->var_decay;
              uVar23 = uVar26;
              if (uVar19 >= uVar26 && uVar19 != uVar26) {
                uVar23 = uVar19;
              }
              if (uVar19 < uVar26) {
                uVar26 = uVar19;
              }
              uVar19 = uVar23 >> 0x20 & 0xffff;
              uVar25 = uVar26 >> 0x20 & 0xffff;
              uVar19 = (uVar19 * (uVar26 & 0xffffffff) >> 0xf) +
                       (uVar25 * (uVar23 & 0xffffffff) >> 0xf) +
                       ((uVar23 & 0xffffffff) * (uVar26 & 0xffffffff) >> 0x2f |
                       uVar19 * uVar25 * 0x20000);
              __tp = (timespec *)0xffffffffffff;
              uVar25 = uVar19 >> (0xffffffffffff < uVar19);
              uVar19 = (ulong)(0xffffffffffff < uVar19) + (uVar26 >> 0x30) + (uVar23 >> 0x30);
              uVar26 = 0xffffffffffffffff;
              if (uVar19 < 0x10000) {
                __tp = (timespec *)0x0;
                if ((uVar25 & 0xffff800000000000) != 0x800000000000) {
LAB_008f608d:
                  __assert_fail("!(Exp>>16) && (Mnt>>47)==(word)1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilDouble.h"
                                ,0x36,"xdbl Xdbl_Create(word, word)");
                }
                uVar26 = uVar19 << 0x30 | uVar25;
              }
              s->var_inc = uVar26;
            }
            else if (iVar9 == 1) {
              s->var_inc = (word)((double)s->var_inc * (double)s->var_decay);
            }
            else {
              if (iVar9 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                              ,399,"void act_var_decay(sat_solver3 *)");
              }
              s->var_inc = (s->var_inc >> 4) + s->var_inc;
            }
            if (s->ClaActType == 0) {
              s->cla_inc = (s->cla_inc >> 10) + s->cla_inc;
            }
            else {
              s->cla_inc = s->cla_inc * s->cla_decay;
            }
          }
          local_50 = local_50 + 1;
          if (local_5c == local_60) {
            bVar29 = false;
          }
          else {
LAB_008f5c87:
            bVar29 = true;
          }
        }
      } while (bVar29);
      if (((s->nConfLimit != 0) && (s->nConfLimit < (s->stats).conflicts)) ||
         ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) goto LAB_008f5fa4;
      if (s->nRuntimeLimit != 0) {
        iVar9 = clock_gettime(3,&local_78);
        if (iVar9 < 0) {
          lVar16 = -1;
        }
        else {
          lVar16 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
        }
        if (s->nRuntimeLimit < lVar16) goto LAB_008f5fa4;
      }
      bVar29 = true;
    }
    else {
      iVar9 = clock_gettime(3,&local_78);
      if (iVar9 < 0) {
        lVar16 = -1;
      }
      else {
        lVar16 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
      }
      if (lVar16 <= s->nRuntimeLimit) goto LAB_008f4180;
LAB_008f5fa4:
      bVar29 = false;
    }
  } while (bVar29);
  if (0 < s->verbosity) {
    puts("==============================================================================");
  }
  sat_solver3_canceluntil(s,s->root_level);
  return (int)cVar8;
}

Assistant:

int sat_solver3_solve_internal(sat_solver3* s)
{
    lbool status = l_Undef;
    int restart_iter = 0;
    veci_resize(&s->unit_lits, 0);
    s->nCalls++;

    if (s->verbosity >= 1){
        printf("==================================[MINISAT]===================================\n");
        printf("| Conflicts |     ORIGINAL     |              LEARNT              | Progress |\n");
        printf("|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |\n");
        printf("==============================================================================\n");
    }

    while (status == l_Undef){
        ABC_INT64_T nof_conflicts;
        double Ratio = (s->stats.learnts == 0)? 0.0 :
            s->stats.learnts_literals / (double)s->stats.learnts;
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
        if (s->verbosity >= 1)
        {
            printf("| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n", 
                (double)s->stats.conflicts,
                (double)s->stats.clauses, 
                (double)s->stats.clauses_literals,
                (double)0, 
                (double)s->stats.learnts, 
                (double)s->stats.learnts_literals,
                Ratio,
                s->progress_estimate*100);
            fflush(stdout);
        }
        nof_conflicts = (ABC_INT64_T)( 100 * luby(2, restart_iter++) );
        status = sat_solver3_search(s, nof_conflicts);
        // quit the loop if reached an external limit
        if ( s->nConfLimit && s->stats.conflicts > s->nConfLimit )
            break;
        if ( s->nInsLimit  && s->stats.propagations > s->nInsLimit )
            break;
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
    }
    if (s->verbosity >= 1)
        printf("==============================================================================\n");

    sat_solver3_canceluntil(s,s->root_level);
    return status;
}